

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O1

void __thiscall FIX44::Message::Message(Message *this,MsgType *msgtype)

{
  long *local_a0;
  long local_98;
  long local_90 [2];
  undefined1 local_80 [16];
  _Alloc_hider local_70;
  char local_60 [16];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  size_t local_30;
  int local_28;
  
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"FIX.4.4","");
  local_80._0_8_ = &PTR__FieldBase_001852e0;
  local_80._8_4_ = 8;
  local_70._M_p = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_a0,local_98 + (long)local_a0);
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_30 = 0;
  local_28 = 0;
  local_80._0_8_ = &PTR__FieldBase_00185568;
  FIX::Message::Message(&this->super_Message,(BeginString *)local_80,msgtype);
  FIX::FieldBase::~FieldBase((FieldBase *)local_80);
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  *(undefined ***)this = &PTR__Message_00185818;
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIX.4.4"), msgtype )
     {}